

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::TransferDisposedObjects
          (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.freeObjectList !=
      (this->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.lastFreeObjectHead) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x201,"(this->IsFreeBitsValid())","this->IsFreeBitsValid()");
    if (!bVar2) goto LAB_00731886;
    *puVar3 = 0;
  }
  if (this->isPendingDispose == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x202,"(this->isPendingDispose)","this->isPendingDispose");
    if (!bVar2) goto LAB_00731886;
    *puVar3 = 0;
  }
  if (this->pendingDisposeCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x203,"(this->pendingDisposeCount == 0)","this->pendingDisposeCount == 0");
    if (!bVar2) {
LAB_00731886:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->isPendingDispose = false;
  SmallHeapBlockT<MediumAllocationBlockAttributes>::TransferProcessedObjects
            ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this,this->disposedObjectList,
             this->disposedObjectListTail);
  this->disposedObjectList = (FreeObject *)0x0;
  this->disposedObjectListTail = (FreeObject *)0x0;
  (this->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
  super_SmallHeapBlockT<MediumAllocationBlockAttributes>.lastFreeObjectHead =
       (this->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
       super_SmallHeapBlockT<MediumAllocationBlockAttributes>.freeObjectList;
  SmallHeapBlockT<MediumAllocationBlockAttributes>::CheckFreeBitVector
            ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this,true);
  return;
}

Assistant:

void
SmallFinalizableHeapBlockT<TBlockAttributes>::TransferDisposedObjects()
{
    // CONCURRENT-TODO: we don't allocate on pending disposed blocks during concurrent sweep or disable dispose
    // So the free bit vector must be valid
    Assert(this->IsFreeBitsValid());
    Assert(this->isPendingDispose);
    Assert(this->pendingDisposeCount == 0);

    DebugOnly(this->isPendingDispose = false);

    this->TransferProcessedObjects(this->disposedObjectList, this->disposedObjectListTail);
    this->disposedObjectList = nullptr;
    this->disposedObjectListTail = nullptr;

    // We already updated the bit vector on TransferSweptObjects
    // So just update the free object head.
    this->lastFreeObjectHead = this->freeObjectList;

    RECYCLER_SLOW_CHECK(this->CheckFreeBitVector(true));
}